

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemSubroutine.cpp
# Opt level: O2

bool __thiscall
slang::ast::SystemSubroutine::checkArgCount
          (SystemSubroutine *this,ASTContext *context,bool isMethod,Args *args,SourceRange callRange
          ,size_t min,size_t max)

{
  pointer ppEVar1;
  bool bVar2;
  reference ppEVar3;
  Diagnostic *pDVar4;
  long lVar5;
  Args *__range2;
  DiagCode code;
  SourceLocation SVar6;
  SourceLocation SVar7;
  size_type sVar8;
  SourceRange sourceRange;
  
  SVar7 = callRange.endLoc;
  SVar6 = callRange.startLoc;
  ppEVar1 = args->data_;
  sVar8 = args->size_;
  lVar5 = 0;
  do {
    if (sVar8 << 3 == lVar5) {
      sVar8 = args->size_;
      if (isMethod) {
        if (sVar8 == 0) {
          assert::assertFailed
                    ("provided",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/SystemSubroutine.cpp"
                     ,0x2f,
                     "bool slang::ast::SystemSubroutine::checkArgCount(const ASTContext &, bool, const Args &, SourceRange, size_t, size_t) const"
                    );
        }
        sVar8 = sVar8 - 1;
      }
      if (sVar8 < min) {
        code.subsystem = Expressions;
        code.code = 0x8c;
      }
      else {
        if (sVar8 <= max) {
          return true;
        }
        ppEVar3 = nonstd::span_lite::
                  span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                            (args,max);
        SVar6 = ((*ppEVar3)->sourceRange).startLoc;
        SVar7 = ((*ppEVar3)->sourceRange).endLoc;
        code.subsystem = Expressions;
        code.code = 0x8d;
        min = max;
      }
      sourceRange.endLoc = SVar7;
      sourceRange.startLoc = SVar6;
      pDVar4 = ASTContext::addDiag(context,code,sourceRange);
      pDVar4 = Diagnostic::operator<<(pDVar4,&this->name);
      pDVar4 = Diagnostic::operator<<(pDVar4,min);
      Diagnostic::operator<<(pDVar4,sVar8);
      return false;
    }
    bVar2 = Expression::bad(*(Expression **)((long)ppEVar1 + lVar5));
    lVar5 = lVar5 + 8;
  } while (!bVar2);
  return false;
}

Assistant:

bool SystemSubroutine::checkArgCount(const ASTContext& context, bool isMethod, const Args& args,
                                     SourceRange callRange, size_t min, size_t max) const {
    for (auto arg : args) {
        if (arg->bad())
            return false;
    }

    size_t provided = args.size();
    if (isMethod) {
        ASSERT(provided);
        provided--;
    }

    if (provided < min) {
        context.addDiag(diag::TooFewArguments, callRange) << name << min << provided;
        return false;
    }

    if (provided > max) {
        context.addDiag(diag::TooManyArguments, args[max]->sourceRange) << name << max << provided;
        return false;
    }

    return true;
}